

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_10x26_impl.h
# Opt level: O1

void secp256k1_fe_normalize_weak(secp256k1_fe *r)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar1 = r->n[9];
  uVar5 = uVar1 >> 0x16;
  uVar2 = uVar5 * 0x3d1 + r->n[0];
  uVar5 = (uVar2 >> 0x1a) + uVar5 * 0x40 + r->n[1];
  uVar6 = (uVar5 >> 0x1a) + r->n[2];
  uVar7 = (uVar6 >> 0x1a) + r->n[3];
  uVar8 = (uVar7 >> 0x1a) + r->n[4];
  uVar9 = (uVar8 >> 0x1a) + r->n[5];
  uVar3 = (uVar9 >> 0x1a) + r->n[6];
  uVar4 = (uVar3 >> 0x1a) + r->n[7];
  uVar10 = (uVar4 >> 0x1a) + r->n[8];
  r->n[0] = uVar2 & 0x3ffffff;
  r->n[1] = uVar5 & 0x3ffffff;
  r->n[2] = uVar6 & 0x3ffffff;
  r->n[3] = uVar7 & 0x3ffffff;
  r->n[4] = uVar8 & 0x3ffffff;
  r->n[5] = uVar9 & 0x3ffffff;
  r->n[6] = uVar3 & 0x3ffffff;
  r->n[7] = uVar4 & 0x3ffffff;
  r->n[8] = uVar10 & 0x3ffffff;
  r->n[9] = (uVar10 >> 0x1a) + (uVar1 & 0x3fffff);
  return;
}

Assistant:

static void secp256k1_fe_normalize_weak(secp256k1_fe *r) {
    uint32_t t0 = r->n[0], t1 = r->n[1], t2 = r->n[2], t3 = r->n[3], t4 = r->n[4],
             t5 = r->n[5], t6 = r->n[6], t7 = r->n[7], t8 = r->n[8], t9 = r->n[9];

    /* Reduce t9 at the start so there will be at most a single carry from the first pass */
    uint32_t x = t9 >> 22; t9 &= 0x03FFFFFUL;

    /* The first pass ensures the magnitude is 1, ... */
    t0 += x * 0x3D1UL; t1 += (x << 6);
    t1 += (t0 >> 26); t0 &= 0x3FFFFFFUL;
    t2 += (t1 >> 26); t1 &= 0x3FFFFFFUL;
    t3 += (t2 >> 26); t2 &= 0x3FFFFFFUL;
    t4 += (t3 >> 26); t3 &= 0x3FFFFFFUL;
    t5 += (t4 >> 26); t4 &= 0x3FFFFFFUL;
    t6 += (t5 >> 26); t5 &= 0x3FFFFFFUL;
    t7 += (t6 >> 26); t6 &= 0x3FFFFFFUL;
    t8 += (t7 >> 26); t7 &= 0x3FFFFFFUL;
    t9 += (t8 >> 26); t8 &= 0x3FFFFFFUL;

    /* ... except for a possible carry at bit 22 of t9 (i.e. bit 256 of the field element) */
    VERIFY_CHECK(t9 >> 23 == 0);

    r->n[0] = t0; r->n[1] = t1; r->n[2] = t2; r->n[3] = t3; r->n[4] = t4;
    r->n[5] = t5; r->n[6] = t6; r->n[7] = t7; r->n[8] = t8; r->n[9] = t9;

#ifdef VERIFY
    r->magnitude = 1;
    secp256k1_fe_verify(r);
#endif
}